

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  uint uVar1;
  stbi__context *psVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  stbi_uc *psVar10;
  stbi_uc *psVar11;
  long lVar12;
  stbi__uint32 sVar13;
  long lVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  byte bVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  stbi_uc *psVar27;
  long lVar28;
  byte bVar29;
  byte bVar30;
  ulong uVar31;
  byte *pbVar32;
  byte *pbVar33;
  ulong uVar34;
  int iVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar14;
  
  psVar2 = a->s;
  uVar4 = x * out_n;
  uVar1 = psVar2->img_n;
  psVar10 = (stbi_uc *)malloc((ulong)(uVar4 * y));
  a->out = psVar10;
  if (psVar10 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
    return 0;
  }
  uVar5 = uVar1 * x;
  sVar13 = uVar5 * depth + 7 >> 3;
  uVar14 = (ulong)sVar13;
  uVar6 = (sVar13 + 1) * y;
  if ((psVar2->img_x == x) && (psVar2->img_y == y)) {
    if (uVar6 == raw_len) {
LAB_0011666d:
      if (y == 0) {
        return 1;
      }
      uVar16 = (ulong)uVar4;
      lVar24 = -uVar16;
      uVar21 = 0;
      uVar37 = (ulong)(uVar4 - sVar13);
      if (7 < depth) {
        uVar37 = uVar21;
      }
      uVar34 = (ulong)uVar1;
      uVar31 = 1;
      if (7 < depth) {
        uVar31 = (ulong)uVar1;
        sVar13 = x;
      }
      lVar20 = (long)out_n;
      uVar6 = (sVar13 - 1) * uVar1;
      uVar25 = (ulong)uVar6;
      lVar28 = -lVar20;
      lVar15 = -(long)(int)uVar31;
      iVar7 = x - 1;
      uVar22 = 0;
      do {
        bVar23 = *raw;
        if (4 < (ulong)bVar23) {
          stbi__g_failure_reason = "invalid filter";
          return 0;
        }
        if (uVar22 == 0) {
          bVar23 = ""[bVar23];
        }
        psVar10 = a->out;
        if (0 < (int)uVar31) {
          uVar26 = 0;
          do {
            switch(bVar23) {
            case 0:
            case 1:
            case 5:
            case 6:
              bVar29 = raw[uVar26 + 1];
              goto LAB_001167c5;
            case 2:
            case 4:
              bVar29 = psVar10[uVar26 + uVar21 + lVar24];
              break;
            case 3:
              bVar29 = psVar10[uVar26 + uVar21 + lVar24] >> 1;
              break;
            default:
              goto switchD_001167ab_default;
            }
            bVar29 = bVar29 + raw[uVar26 + 1];
LAB_001167c5:
            psVar10[uVar26 + uVar21 + uVar37] = bVar29;
switchD_001167ab_default:
            uVar26 = uVar26 + 1;
          } while (uVar31 != uVar26);
        }
        uVar8 = uVar4 * (int)uVar22;
        if (depth == 8) {
          if (uVar1 != out_n) {
            psVar10[(long)(int)uVar1 + (ulong)uVar8] = 0xff;
          }
          raw = raw + (long)(int)uVar1 + 1;
          lVar12 = lVar20 + (ulong)uVar8;
          lVar17 = lVar20;
        }
        else {
          raw = raw + 2;
          lVar12 = uVar37 + uVar8 + 1;
          lVar17 = 1;
        }
        psVar27 = psVar10 + lVar12;
        if (uVar1 == out_n || depth < 8) {
          switch(bVar23) {
          case 0:
            memcpy(psVar27,raw,(long)(int)uVar6);
            break;
          case 1:
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                psVar27[uVar26] = psVar27[uVar26 + lVar15] + raw[uVar26];
                uVar26 = uVar26 + 1;
              } while (uVar25 != uVar26);
            }
            break;
          case 2:
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                psVar27[uVar26] = psVar10[uVar26 + lVar17 + uVar21 + lVar24] + raw[uVar26];
                uVar26 = uVar26 + 1;
              } while (uVar25 != uVar26);
            }
            break;
          case 3:
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                psVar27[uVar26] =
                     (char)((uint)psVar27[uVar26 + lVar15] +
                            (uint)psVar10[uVar26 + lVar17 + uVar21 + lVar24] >> 1) + raw[uVar26];
                uVar26 = uVar26 + 1;
              } while (uVar25 != uVar26);
            }
            break;
          case 4:
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                bVar23 = psVar27[uVar26 + lVar15];
                bVar29 = psVar10[uVar26 + lVar17 + uVar21 + lVar24];
                bVar30 = psVar10[uVar26 + lVar17 + uVar21 + (lVar15 - uVar16)];
                iVar35 = ((uint)bVar29 + (uint)bVar23) - (uint)bVar30;
                uVar9 = iVar35 - (uint)bVar23;
                uVar8 = -uVar9;
                if (0 < (int)uVar9) {
                  uVar8 = uVar9;
                }
                uVar18 = iVar35 - (uint)bVar29;
                uVar9 = -uVar18;
                if (0 < (int)uVar18) {
                  uVar9 = uVar18;
                }
                uVar36 = iVar35 - (uint)bVar30;
                uVar18 = -uVar36;
                if (0 < (int)uVar36) {
                  uVar18 = uVar36;
                }
                if (uVar9 <= uVar18) {
                  bVar30 = bVar29;
                }
                if (uVar18 < uVar8) {
                  bVar23 = bVar30;
                }
                if (uVar9 < uVar8) {
                  bVar23 = bVar30;
                }
                psVar27[uVar26] = bVar23 + raw[uVar26];
                uVar26 = uVar26 + 1;
              } while (uVar25 != uVar26);
            }
            break;
          case 5:
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                psVar27[uVar26] = (psVar27[uVar26 + lVar15] >> 1) + raw[uVar26];
                uVar26 = uVar26 + 1;
              } while (uVar25 != uVar26);
            }
            break;
          case 6:
            if (0 < (int)uVar6) {
              uVar26 = 0;
              do {
                psVar27[uVar26] = psVar27[uVar26 + lVar15] + raw[uVar26];
                uVar26 = uVar26 + 1;
              } while (uVar25 != uVar26);
            }
          }
          raw = raw + (int)uVar6;
        }
        else if (bVar23 < 7) {
          psVar11 = psVar10 + lVar17 + lVar24 + (ulong)uVar8;
          switch(bVar23) {
          case 0:
            for (iVar35 = iVar7; iVar35 != 0; iVar35 = iVar35 + -1) {
              if (0 < (int)uVar1) {
                uVar26 = 0;
                do {
                  psVar27[uVar26] = raw[uVar26];
                  uVar26 = uVar26 + 1;
                } while (uVar34 != uVar26);
              }
              psVar27[(int)uVar1] = 0xff;
              raw = raw + (int)uVar1;
              psVar27 = psVar27 + lVar20;
            }
            break;
          case 1:
            if (iVar7 != 0) {
              lVar12 = lVar28 + (long)psVar27;
              iVar35 = iVar7;
              do {
                if (0 < (int)uVar1) {
                  uVar26 = 0;
                  do {
                    psVar27[uVar26] = *(char *)(lVar12 + uVar26) + raw[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar34 != uVar26);
                }
                psVar27[(int)uVar1] = 0xff;
                raw = raw + (int)uVar1;
                psVar27 = psVar27 + lVar20;
                lVar12 = lVar12 + lVar20;
                iVar35 = iVar35 + -1;
              } while (iVar35 != 0);
            }
            break;
          case 2:
            for (iVar35 = iVar7; iVar35 != 0; iVar35 = iVar35 + -1) {
              if (0 < (int)uVar1) {
                uVar26 = 0;
                do {
                  psVar27[uVar26] = psVar11[uVar26] + raw[uVar26];
                  uVar26 = uVar26 + 1;
                } while (uVar34 != uVar26);
              }
              psVar27[(int)uVar1] = 0xff;
              raw = raw + (int)uVar1;
              psVar27 = psVar27 + lVar20;
              psVar11 = psVar11 + lVar20;
            }
            break;
          case 3:
            if (iVar7 != 0) {
              lVar12 = lVar28 + (long)psVar27;
              iVar35 = iVar7;
              do {
                if (0 < (int)uVar1) {
                  uVar26 = 0;
                  do {
                    psVar27[uVar26] =
                         (char)((uint)*(byte *)(lVar12 + uVar26) + (uint)psVar11[uVar26] >> 1) +
                         raw[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar34 != uVar26);
                }
                psVar27[(int)uVar1] = 0xff;
                raw = raw + (int)uVar1;
                psVar27 = psVar27 + lVar20;
                psVar11 = psVar11 + lVar20;
                lVar12 = lVar12 + lVar20;
                iVar35 = iVar35 + -1;
              } while (iVar35 != 0);
            }
            break;
          case 4:
            if (iVar7 != 0) {
              lVar12 = lVar28 + (long)psVar27;
              psVar10 = psVar10 + lVar17 + uVar21 + (lVar28 - uVar16);
              iVar35 = iVar7;
              do {
                if (0 < (int)uVar1) {
                  uVar26 = 0;
                  do {
                    bVar23 = *(byte *)(lVar12 + uVar26);
                    bVar29 = psVar11[uVar26];
                    bVar30 = psVar10[uVar26];
                    iVar19 = ((uint)bVar29 + (uint)bVar23) - (uint)bVar30;
                    uVar9 = iVar19 - (uint)bVar23;
                    uVar8 = -uVar9;
                    if (0 < (int)uVar9) {
                      uVar8 = uVar9;
                    }
                    uVar18 = iVar19 - (uint)bVar29;
                    uVar9 = -uVar18;
                    if (0 < (int)uVar18) {
                      uVar9 = uVar18;
                    }
                    uVar36 = iVar19 - (uint)bVar30;
                    uVar18 = -uVar36;
                    if (0 < (int)uVar36) {
                      uVar18 = uVar36;
                    }
                    if (uVar9 <= uVar18) {
                      bVar30 = bVar29;
                    }
                    if (uVar18 < uVar8) {
                      bVar23 = bVar30;
                    }
                    if (uVar9 < uVar8) {
                      bVar23 = bVar30;
                    }
                    psVar27[uVar26] = bVar23 + raw[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar34 != uVar26);
                }
                psVar27[(int)uVar1] = 0xff;
                raw = raw + (int)uVar1;
                psVar27 = psVar27 + lVar20;
                psVar11 = psVar11 + lVar20;
                lVar12 = lVar12 + lVar20;
                psVar10 = psVar10 + lVar20;
                iVar35 = iVar35 + -1;
              } while (iVar35 != 0);
            }
            break;
          case 5:
            if (iVar7 != 0) {
              lVar12 = lVar28 + (long)psVar27;
              iVar35 = iVar7;
              do {
                if (0 < (int)uVar1) {
                  uVar26 = 0;
                  do {
                    psVar27[uVar26] = (*(byte *)(lVar12 + uVar26) >> 1) + raw[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar34 != uVar26);
                }
                psVar27[(int)uVar1] = 0xff;
                raw = raw + (int)uVar1;
                psVar27 = psVar27 + lVar20;
                lVar12 = lVar12 + lVar20;
                iVar35 = iVar35 + -1;
              } while (iVar35 != 0);
            }
            break;
          case 6:
            if (iVar7 != 0) {
              lVar12 = lVar28 + (long)psVar27;
              iVar35 = iVar7;
              do {
                if (0 < (int)uVar1) {
                  uVar26 = 0;
                  do {
                    psVar27[uVar26] = *(char *)(lVar12 + uVar26) + raw[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar34 != uVar26);
                }
                psVar27[(int)uVar1] = 0xff;
                raw = raw + (int)uVar1;
                psVar27 = psVar27 + lVar20;
                lVar12 = lVar12 + lVar20;
                iVar35 = iVar35 + -1;
              } while (iVar35 != 0);
            }
          }
        }
        uVar22 = uVar22 + 1;
        uVar21 = (ulong)((int)uVar21 + uVar4);
        if (uVar22 == y) {
          if (depth < 8) {
            uVar6 = x - 1;
            lVar15 = uVar16 - uVar14;
            lVar24 = (ulong)uVar6 + 1;
            uVar8 = 0;
            uVar37 = 0;
            do {
              bVar23 = 1;
              if (color == 0) {
                bVar23 = ""[(uint)depth];
              }
              psVar10 = a->out;
              pbVar32 = psVar10 + uVar4 * (int)uVar37;
              pbVar33 = pbVar32 + (uVar16 - uVar14);
              uVar21 = (ulong)uVar8;
              if (depth == 4) {
                uVar9 = uVar5;
                if (1 < (int)uVar5) {
                  psVar27 = psVar10 + lVar15;
                  uVar18 = uVar5;
                  do {
                    psVar10[uVar21] = (psVar27[uVar21] >> 4) * bVar23;
                    psVar10[uVar21 + 1] = (psVar27[uVar21] & 0xf) * bVar23;
                    uVar9 = uVar18 - 2;
                    psVar27 = psVar27 + 1;
                    psVar10 = psVar10 + 2;
                    bVar3 = 3 < uVar18;
                    uVar18 = uVar9;
                  } while (bVar3);
                  pbVar33 = psVar27 + uVar21;
                  pbVar32 = psVar10 + uVar21;
                }
                if (uVar9 == 1) {
                  *pbVar32 = (*pbVar33 >> 4) * bVar23;
                }
              }
              else if (depth == 2) {
                uVar9 = uVar5;
                if (3 < (int)uVar5) {
                  psVar27 = psVar10 + lVar15;
                  uVar18 = uVar5;
                  do {
                    psVar10[uVar21] = (psVar27[uVar21] >> 6) * bVar23;
                    psVar10[uVar21 + 1] = (psVar27[uVar21] >> 4 & 3) * bVar23;
                    psVar10[uVar21 + 2] = (psVar27[uVar21] >> 2 & 3) * bVar23;
                    psVar10[uVar21 + 3] = (psVar27[uVar21] & 3) * bVar23;
                    uVar9 = uVar18 - 4;
                    psVar27 = psVar27 + 1;
                    psVar10 = psVar10 + 4;
                    bVar3 = 7 < uVar18;
                    uVar18 = uVar9;
                  } while (bVar3);
                  pbVar33 = psVar27 + uVar21;
                  pbVar32 = psVar10 + uVar21;
                }
                if (((0 < (int)uVar9) && (*pbVar32 = (*pbVar33 >> 6) * bVar23, uVar9 != 1)) &&
                   (pbVar32[1] = (*pbVar33 >> 4 & 3) * bVar23, uVar9 == 3)) {
                  pbVar32[2] = (*pbVar33 >> 2 & 3) * bVar23;
                }
              }
              else if (depth == 1) {
                uVar9 = uVar5;
                if (7 < (int)uVar5) {
                  psVar27 = psVar10 + lVar15;
                  uVar18 = uVar5;
                  do {
                    psVar10[uVar21] = (char)psVar27[uVar21] >> 7 & bVar23;
                    psVar10[uVar21 + 1] = (char)(psVar27[uVar21] * '\x02') >> 7 & bVar23;
                    psVar10[uVar21 + 2] = (char)(psVar27[uVar21] << 2) >> 7 & bVar23;
                    psVar10[uVar21 + 3] = (char)(psVar27[uVar21] << 3) >> 7 & bVar23;
                    psVar10[uVar21 + 4] = (char)(psVar27[uVar21] << 4) >> 7 & bVar23;
                    psVar10[uVar21 + 5] = (char)(psVar27[uVar21] << 5) >> 7 & bVar23;
                    psVar10[uVar21 + 6] = (char)(psVar27[uVar21] << 6) >> 7 & bVar23;
                    bVar29 = bVar23;
                    if ((psVar27[uVar21] & 1) == 0) {
                      bVar29 = 0;
                    }
                    psVar10[uVar21 + 7] = bVar29;
                    uVar9 = uVar18 - 8;
                    psVar27 = psVar27 + 1;
                    psVar10 = psVar10 + 8;
                    bVar3 = 0xf < uVar18;
                    uVar18 = uVar9;
                  } while (bVar3);
                  pbVar33 = psVar27 + uVar21;
                  pbVar32 = psVar10 + uVar21;
                }
                if (((((0 < (int)uVar9) && (*pbVar32 = (char)*pbVar33 >> 7 & bVar23, uVar9 != 1)) &&
                     ((pbVar32[1] = (char)(*pbVar33 * '\x02') >> 7 & bVar23, 2 < uVar9 &&
                      ((pbVar32[2] = (char)(*pbVar33 << 2) >> 7 & bVar23, uVar9 != 3 &&
                       (pbVar32[3] = (char)(*pbVar33 << 3) >> 7 & bVar23, 4 < uVar9)))))) &&
                    (pbVar32[4] = (char)(*pbVar33 << 4) >> 7 & bVar23, uVar9 != 5)) &&
                   (pbVar32[5] = (char)(*pbVar33 << 5) >> 7 & bVar23, uVar9 == 7)) {
                  pbVar32[6] = (char)(*pbVar33 << 6) >> 7 & bVar23;
                }
              }
              if (uVar1 != out_n) {
                psVar10 = a->out;
                if (uVar1 == 1) {
                  lVar20 = lVar24;
                  if (-1 < (int)uVar6) {
                    do {
                      psVar10[lVar20 * 2 + (uVar21 - 1)] = 0xff;
                      psVar10[lVar20 * 2 + (uVar21 - 2)] = psVar10[lVar20 + (uVar21 - 1)];
                      lVar28 = lVar20 + -1;
                      bVar3 = 0 < lVar20;
                      lVar20 = lVar28;
                    } while (lVar28 != 0 && bVar3);
                  }
                }
                else if (-1 < (int)uVar6) {
                  psVar27 = psVar10 + (ulong)uVar6 * 3 + 2 + uVar21;
                  lVar20 = lVar24;
                  do {
                    psVar10[lVar20 * 4 + (uVar21 - 1)] = 0xff;
                    psVar10[lVar20 * 4 + (uVar21 - 2)] = *psVar27;
                    psVar10[lVar20 * 4 + (uVar21 - 3)] = psVar27[-1];
                    psVar10[lVar20 * 4 + (uVar21 - 4)] = psVar27[-2];
                    psVar27 = psVar27 + -3;
                    lVar28 = lVar20 + -1;
                    bVar3 = 0 < lVar20;
                    lVar20 = lVar28;
                  } while (lVar28 != 0 && bVar3);
                }
              }
              uVar37 = uVar37 + 1;
              uVar8 = uVar8 + uVar4;
            } while (uVar37 != y);
            return 1;
          }
          return 1;
        }
      } while( true );
    }
  }
  else if (uVar6 <= raw_len) goto LAB_0011666d;
  stbi__g_failure_reason = "not enough pixels";
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc(x * y * out_n); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   if (s->img_x == x && s->img_y == y) {
      if (raw_len != img_len) return stbi__err("not enough pixels","Corrupt PNG");
   } else { // interlaced:
      if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");
   }

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior = cur - stride;
      int filter = *raw++;
      int filter_bytes = img_n;
      int width = x;
      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*img_n;
         #define CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); break;
         }
         #undef CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[img_n]=255,raw+=img_n,cur+=out_n,prior+=out_n) \
                   for (k=0; k < img_n; ++k)
         switch (filter) {
            CASE(STBI__F_none)         cur[k] = raw[k]; break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-out_n]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-out_n])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],prior[k],prior[k-out_n])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-out_n] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],0,0)); break;
         }
         #undef CASE
      }
   }

   // we make a separate pass to expand bits to pixels; for performance,
   // this could run two scanlines behind the above code, so it won't
   // intefere with filtering but will still be in the cache.
   if (depth < 8) {
      for (j=0; j < y; ++j) {
         stbi_uc *cur = a->out + stride*j;
         stbi_uc *in  = a->out + stride*j + x*out_n - img_width_bytes;
         // unpack 1/2/4-bit into a 8-bit buffer. allows us to keep the common 8-bit path optimal at minimal cost for 1/2/4-bit
         // png guarante byte alignment, if width is not multiple of 8/4/2 we'll decode dummy trailing data that will be skipped in the later loop
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range

         // note that the final byte might overshoot and write more data than desired.
         // we can allocate enough data that this never writes out of memory, but it
         // could also overwrite the next scanline. can it overwrite non-empty data
         // on the next scanline? yes, consider 1-pixel-wide scanlines with 1-bit-per-pixel.
         // so we need to explicitly clamp the final ones

         if (depth == 4) {
            for (k=x*img_n; k >= 2; k-=2, ++in) {
               *cur++ = scale * ((*in >> 4)       );
               *cur++ = scale * ((*in     ) & 0x0f);
            }
            if (k > 0) *cur++ = scale * ((*in >> 4)       );
         } else if (depth == 2) {
            for (k=x*img_n; k >= 4; k-=4, ++in) {
               *cur++ = scale * ((*in >> 6)       );
               *cur++ = scale * ((*in >> 4) & 0x03);
               *cur++ = scale * ((*in >> 2) & 0x03);
               *cur++ = scale * ((*in     ) & 0x03);
            }
            if (k > 0) *cur++ = scale * ((*in >> 6)       );
            if (k > 1) *cur++ = scale * ((*in >> 4) & 0x03);
            if (k > 2) *cur++ = scale * ((*in >> 2) & 0x03);
         } else if (depth == 1) {
            for (k=x*img_n; k >= 8; k-=8, ++in) {
               *cur++ = scale * ((*in >> 7)       );
               *cur++ = scale * ((*in >> 6) & 0x01);
               *cur++ = scale * ((*in >> 5) & 0x01);
               *cur++ = scale * ((*in >> 4) & 0x01);
               *cur++ = scale * ((*in >> 3) & 0x01);
               *cur++ = scale * ((*in >> 2) & 0x01);
               *cur++ = scale * ((*in >> 1) & 0x01);
               *cur++ = scale * ((*in     ) & 0x01);
            }
            if (k > 0) *cur++ = scale * ((*in >> 7)       );
            if (k > 1) *cur++ = scale * ((*in >> 6) & 0x01);
            if (k > 2) *cur++ = scale * ((*in >> 5) & 0x01);
            if (k > 3) *cur++ = scale * ((*in >> 4) & 0x01);
            if (k > 4) *cur++ = scale * ((*in >> 3) & 0x01);
            if (k > 5) *cur++ = scale * ((*in >> 2) & 0x01);
            if (k > 6) *cur++ = scale * ((*in >> 1) & 0x01);
         }
         if (img_n != out_n) {
            // insert alpha = 255
            stbi_uc *cur = a->out + stride*j;
            int i;
            if (img_n == 1) {
               for (i=x-1; i >= 0; --i) {
                  cur[i*2+1] = 255;
                  cur[i*2+0] = cur[i];
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i=x-1; i >= 0; --i) {
                  cur[i*4+3] = 255;
                  cur[i*4+2] = cur[i*3+2];
                  cur[i*4+1] = cur[i*3+1];
                  cur[i*4+0] = cur[i*3+0];
               }
            }
         }
      }
   }

   return 1;
}